

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall Clasp::DefaultUnfoundedCheck::resetTodo(DefaultUnfoundedCheck *this)

{
  pointer pAVar1;
  uint uVar2;
  
  while( true ) {
    uVar2 = (this->todo_).qFront;
    if (uVar2 == (this->todo_).vec.ebo_.size) break;
    (this->todo_).qFront = uVar2 + 1;
    pAVar1 = (this->atoms_).ebo_.buf + (this->todo_).vec.ebo_.buf[uVar2];
    *pAVar1 = (AtomData)((uint)*pAVar1 & 0xdfffffff);
  }
  (this->todo_).vec.ebo_.size = 0;
  (this->todo_).qFront = 0;
  return;
}

Assistant:

bool      empty() const   { return qFront == vec.size(); }